

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoDecompress.c
# Opt level: O1

UINT16 MakeTable(SCRATCH_DATA *Sd,UINT16 NumOfChar,UINT8 *BitLen,UINT16 TableBits,UINT16 *Table)

{
  byte bVar1;
  byte bVar2;
  UINT16 UVar3;
  uint uVar4;
  byte bVar5;
  long lVar6;
  UINT16 *pUVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ushort uVar11;
  undefined6 in_register_00000032;
  ulong uVar12;
  ushort uVar13;
  short sVar14;
  ulong uVar15;
  ulong uVar16;
  UINT16 Start [18];
  UINT16 Count [17];
  UINT16 Weight [17];
  ushort local_b8 [24];
  ushort local_88 [23];
  short asStack_5a [21];
  
  uVar16 = CONCAT62(in_register_00000032,NumOfChar) & 0xffffffff;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[8] = 0;
  local_88[9] = 0;
  local_88[10] = 0;
  local_88[0xb] = 0;
  local_88[0xc] = 0;
  local_88[0xd] = 0;
  local_88[0xe] = 0;
  local_88[0xf] = 0;
  local_88[0x10] = 0;
  if ((int)CONCAT62(in_register_00000032,NumOfChar) != 0) {
    lVar6 = 0;
    do {
      if (0x10 < (ulong)BitLen[lVar6]) {
        return 0xffff;
      }
      local_88[BitLen[lVar6]] = local_88[BitLen[lVar6]] + 1;
      lVar6 = lVar6 + 1;
    } while ((short)uVar16 != (short)lVar6);
  }
  local_b8[0] = 0;
  local_b8[1] = 0;
  bVar5 = 0xf;
  lVar6 = 0;
  iVar8 = 0;
  do {
    iVar8 = iVar8 + ((uint)local_88[lVar6 + 1] << (bVar5 & 0x1f));
    local_b8[lVar6 + 2] = (ushort)iVar8;
    lVar6 = lVar6 + 1;
    bVar5 = bVar5 - 1;
  } while (lVar6 != 0x10);
  UVar3 = 0xffff;
  if (local_b8[0x11] == 0) {
    bVar2 = (byte)TableBits;
    bVar5 = 0x10 - bVar2;
    asStack_5a[1] = 0;
    if (TableBits == 0) {
      uVar12 = 1;
    }
    else {
      uVar13 = 2;
      if (2 < (ushort)(TableBits + 1)) {
        uVar13 = TableBits + 1;
      }
      uVar12 = 1;
      UVar3 = TableBits;
      do {
        UVar3 = UVar3 - 1;
        local_b8[uVar12] = local_b8[uVar12] >> (bVar5 & 0x1f);
        asStack_5a[uVar12 + 1] = (short)(1 << ((byte)UVar3 & 0x1f));
        uVar12 = uVar12 + 1;
      } while (uVar13 != uVar12);
    }
    if ((ushort)uVar12 < 0x11) {
      uVar12 = uVar12 & 0xffff;
      iVar8 = 0x10 - (int)uVar12;
      do {
        uVar12 = uVar12 + 1;
        asStack_5a[uVar12] = (short)(1 << ((byte)iVar8 & 0x1f));
        iVar8 = iVar8 + -1;
      } while ((short)uVar12 != 0x11);
    }
    uVar13 = local_b8[(ulong)TableBits + 1] >> (bVar5 & 0x1f);
    uVar9 = (uint)uVar13;
    if ((uVar13 != 0) &&
       (uVar4 = 1 << (bVar2 & 0x1f) & 0xffff, iVar8 = uVar4 - uVar9, uVar9 <= uVar4 && iVar8 != 0))
    {
      memset(Table + uVar9,0,(long)iVar8 * 2);
    }
    if ((short)uVar16 != 0) {
      uVar12 = 0;
      do {
        bVar1 = BitLen[uVar12];
        if (0xef < (byte)(bVar1 - 0x11)) {
          uVar13 = *(ushort *)((long)local_b8 + (ulong)((uint)bVar1 + (uint)bVar1));
          uVar15 = (ulong)uVar13;
          uVar11 = *(short *)((long)asStack_5a + (ulong)((uint)bVar1 + (uint)bVar1) + 2) + uVar13;
          if (TableBits < bVar1) {
            pUVar7 = Table + (uVar13 >> (bVar5 & 0x1f));
            if (bVar1 != TableBits) {
              sVar14 = TableBits - bVar1;
              uVar15 = uVar16;
              do {
                uVar16 = uVar15;
                if (*pUVar7 == 0) {
                  uVar10 = uVar15 & 0xffff;
                  if ((uint)uVar10 < 0x3fb) {
                    Sd->mLeft[uVar10] = 0;
                    Sd->mRight[uVar10] = 0;
                    uVar16 = (ulong)((uint)uVar10 + 1);
                    *pUVar7 = (ushort)uVar15;
                  }
                }
                uVar15 = (ulong)*pUVar7;
                if (uVar15 < 0x3fb) {
                  if ((uVar13 & (ushort)(0x8000 >> (bVar2 & 0x1f))) == 0) {
                    pUVar7 = Sd->mLeft + uVar15;
                  }
                  else {
                    pUVar7 = Sd->mRight + uVar15;
                  }
                }
                uVar13 = uVar13 * 2;
                sVar14 = sVar14 + 1;
                uVar15 = uVar16;
              } while (sVar14 != 0);
            }
            *pUVar7 = (ushort)uVar12;
          }
          else if (uVar13 < uVar11) {
            do {
              if ((1 << (bVar2 & 0x1f) & 0xffff) <= uVar15) {
                return 0xffff;
              }
              Table[uVar15] = (ushort)uVar12;
              uVar15 = uVar15 + 1;
            } while (uVar11 != uVar15);
          }
          local_b8[bVar1] = uVar11;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != NumOfChar);
    }
    UVar3 = 0;
  }
  return UVar3;
}

Assistant:

STATIC
UINT16
MakeTable (
    IN  SCRATCH_DATA  *Sd,
    IN  UINT16        NumOfChar,
    IN  UINT8         *BitLen,
    IN  UINT16        TableBits,
    OUT UINT16        *Table
    )
{
    UINT16  Count[17];
    UINT16  Weight[17];
    UINT16  Start[18];
    UINT16  *Pointer;
    UINT16  Index3;
    UINT16  Index;
    UINT16  Len;
    UINT16  Char;
    UINT16  JuBits;
    UINT16  Avail;
    UINT16  NextCode;
    UINT16  Mask;
    UINT16  WordOfStart;
    UINT16  WordOfCount;
    UINT16  MaxTableLength;

    //
    // The maximum mapping table width supported by this internal
    // working function is 16.
    //
    if (TableBits >= (sizeof(Count) / sizeof(UINT16))) {
        return (UINT16)BAD_TABLE;
    }

    //
    // Initialize Count array starting from Index 0, as there is a possibility of Count array being uninitialized.
    //
    for (Index = 0; Index <= 16; Index++) {
        Count[Index] = 0;
    }

    for (Index = 0; Index < NumOfChar; Index++) {
        if (BitLen[Index] > 16) {
            return (UINT16)BAD_TABLE;
        }
        Count[BitLen[Index]]++;
    }

    Start[0] = 0;
    Start[1] = 0;

    for (Index = 1; Index <= 16; Index++) {
        WordOfStart = Start[Index];
        WordOfCount = Count[Index];
        Start[Index + 1] = (UINT16)(WordOfStart + (WordOfCount << (16 - Index)));
    }

    if (Start[17] != 0) {
        /*(1U << 16)*/
        return (UINT16)BAD_TABLE;
    }

    JuBits = (UINT16)(16 - TableBits);

    Weight[0] = 0;
    for (Index = 1; Index <= TableBits; Index++) {
        Start[Index] >>= JuBits;
        Weight[Index] = (UINT16)(1U << (TableBits - Index));
    }

    while (Index <= 16) {
        Weight[Index] = (UINT16)(1U << (16 - Index));
        Index++;
    }

    Index = (UINT16)(Start[TableBits + 1] >> JuBits);

    if (Index != 0) {
        Index3 = (UINT16)(1U << TableBits);
        if (Index < Index3) {
            SetMem16 (Table + Index, (Index3 - Index) * sizeof(*Table), 0);
        }
    }

    Avail = NumOfChar;
    Mask = (UINT16)(1U << (15 - TableBits));
    MaxTableLength = (UINT16)(1U << TableBits);

    for (Char = 0; Char < NumOfChar; Char++) {
        Len = BitLen[Char];
        if (Len == 0 || Len >= 17) {
            continue;
        }

        NextCode = (UINT16)(Start[Len] + Weight[Len]);

        if (Len <= TableBits) {

            for (Index = Start[Len]; Index < NextCode; Index++) {
                if (Index >= MaxTableLength) {
                    return (UINT16)BAD_TABLE;
                }
                Table[Index] = Char;
            }

        }
        else {
            Index3 = Start[Len];
            Pointer = &Table[Index3 >> JuBits];
            Index = (UINT16)(Len - TableBits);

            while (Index != 0) {
                if (*Pointer == 0 && Avail < (2 * NC - 1)) {
                    Sd->mRight[Avail] = Sd->mLeft[Avail] = 0;
                    *Pointer = Avail++;
                }

                if (*Pointer < (2 * NC - 1)) {
                    if ((Index3 & Mask) != 0) {
                        Pointer = &Sd->mRight[*Pointer];
                    }
                    else {
                        Pointer = &Sd->mLeft[*Pointer];
                    }
                }

                Index3 <<= 1;
                Index--;
            }

            *Pointer = Char;

        }

        Start[Len] = NextCode;
    }
    //
    // Succeeds
    //
    return 0;
}